

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicStoreExpr
          (ExprVisitorDelegate *this,AtomicStoreExpr *expr)

{
  WatWriter *this_00;
  bool bVar1;
  char *local_50;
  
  if (*(int *)&expr->field_0x38 == 3) {
    this_00 = this->writer_;
    Opcode::GetInfo(&expr->opcode);
    WritePuts(this_00,local_50,Space);
    if (expr->offset != 0) {
      Writef(this_00,"offset=%u");
    }
    bVar1 = Opcode::IsNaturallyAligned(&expr->opcode,expr->align);
    if (!bVar1) {
      Writef(this_00,"align=%u",(ulong)expr->align);
    }
    if (this_00->next_char_ == ForceNewline) {
      WriteNextChar(this_00);
    }
    this_00->next_char_ = Newline;
    return (Result)Ok;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x48,
                "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::AtomicStore>, Base = wabt::Expr]"
               );
}

Assistant:

void WatWriter::WriteTypes(const TypeVector& types, const char* name) {
  if (types.size()) {
    if (name) {
      WriteOpenSpace(name);
    }
    for (Type type : types) {
      WriteType(type, NextChar::Space);
    }
    if (name) {
      WriteCloseSpace();
    }
  }
}